

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  uint uVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  uint32_t uVar4;
  __node_base_ptr p_Var5;
  __hash_code __code;
  ulong uVar6;
  size_t sVar7;
  __node_base_ptr p_Var8;
  TemporaryCopy TVar9;
  _Hash_node_base *p_Var10;
  Instruction *instruction;
  long lVar11;
  EmbeddedInstruction inst;
  undefined8 local_88;
  undefined4 local_80;
  SmallVector<unsigned_int,_8UL> local_78;
  SPIRBlock *local_40;
  TemporaryCopy local_38;
  
  this->current_emitting_block = block;
  local_40 = block;
  if (((this->backend).requires_relaxed_precision_analysis == true) &&
     (sVar7 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size,
     sVar7 != 0)) {
    TVar9 = (TemporaryCopy)(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
    local_38 = (TemporaryCopy)((long)TVar9 + sVar7 * 0xc);
    do {
      uVar1 = *(uint *)((long)TVar9 + 8);
      uVar2 = (this->temporary_to_mirror_precision_alias)._M_h._M_bucket_count;
      uVar6 = (ulong)uVar1 % uVar2;
      p_Var3 = (this->temporary_to_mirror_precision_alias)._M_h._M_buckets[uVar6];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var3, p_Var8 = p_Var3->_M_nxt, uVar1 != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var10 = p_Var8->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar2 != uVar6) ||
             (p_Var5 = p_Var8, p_Var8 = p_Var10, uVar1 == *(uint *)&p_Var10[1]._M_nxt))
          goto LAB_001ff1a2;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_001ff1a2:
      if (p_Var5 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var5->_M_nxt;
      }
      if (p_Var10 != (_Hash_node_base *)0x0) {
        local_78.super_VectorView<unsigned_int>.buffer_size = 0;
        local_78.buffer_capacity = 8;
        local_88 = 0x53;
        local_80 = 3;
        local_78.super_VectorView<unsigned_int>.ptr = (uint *)&local_78.stack_storage;
        uVar4 = Compiler::expression_type_id(&this->super_Compiler,*(uint32_t *)&p_Var10[1]._M_nxt);
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_78,local_78.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint32_t *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) = uVar4;
        sVar7 = local_78.super_VectorView<unsigned_int>.buffer_size + 2;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_78,sVar7);
        *(undefined4 *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) =
             *(undefined4 *)((long)&p_Var10[1]._M_nxt + 4);
        sVar7 = local_78.super_VectorView<unsigned_int>.buffer_size + 2;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_78,sVar7);
        *(undefined4 *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) =
             *(undefined4 *)&p_Var10[1]._M_nxt;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        (*(this->super_Compiler)._vptr_Compiler[8])(this,&local_88);
        local_78.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_78.super_VectorView<unsigned_int>.ptr !=
            &local_78.stack_storage) {
          free(local_78.super_VectorView<unsigned_int>.ptr);
        }
      }
      TVar9 = (TemporaryCopy)((long)TVar9 + 0xc);
    } while (TVar9 != local_38);
  }
  sVar7 = (local_40->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar7 != 0) {
    instruction = (local_40->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    lVar11 = sVar7 * 0xc;
    do {
      TVar9 = handle_instruction_precision(this,instruction);
      (*(this->super_Compiler)._vptr_Compiler[8])(this,instruction);
      if (TVar9.dst_id != 0) {
        local_78.super_VectorView<unsigned_int>.buffer_size = 0;
        local_78.buffer_capacity = 8;
        local_88 = 0x53;
        local_80 = 3;
        local_78.super_VectorView<unsigned_int>.ptr = (uint *)&local_78.stack_storage;
        local_38 = TVar9;
        uVar4 = Compiler::expression_type_id(&this->super_Compiler,TVar9.src_id);
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_78,local_78.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint32_t *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) = uVar4;
        sVar7 = local_78.super_VectorView<unsigned_int>.buffer_size + 2;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_78,sVar7);
        *(uint32_t *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) = local_38.dst_id;
        sVar7 = local_78.super_VectorView<unsigned_int>.buffer_size + 2;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_78,sVar7);
        *(uint32_t *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) = TVar9.src_id;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        this->block_temporary_hoisting = true;
        (*(this->super_Compiler)._vptr_Compiler[8])(this,&local_88);
        this->block_temporary_hoisting = false;
        local_78.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_78.super_VectorView<unsigned_int>.ptr !=
            &local_78.stack_storage) {
          free(local_78.super_VectorView<unsigned_int>.ptr);
        }
      }
      instruction = instruction + 1;
      lVar11 = lVar11 + -0xc;
    } while (lVar11 != 0);
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (auto &phi : block.phi_variables)
		{
			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}